

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O3

bool __thiscall TSDemuxer::checkForRealM2ts(TSDemuxer *this,uint8_t *buffer,uint8_t *end)

{
  uint8_t *puVar1;
  ostream *poVar2;
  uint8_t *cur;
  
  puVar1 = buffer;
  if (end <= buffer) {
    return false;
  }
  do {
    if (puVar1[4] != 'G') {
      return false;
    }
    puVar1 = puVar1 + 0xc0;
  } while (puVar1 < end);
  while( true ) {
    if (end <= buffer) {
      return false;
    }
    if (*buffer != 'G') break;
    buffer = buffer + 0xbc;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Warning! The file ",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->m_streamName)._M_dataplus._M_p,
                      (this->m_streamName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," has a M2TS format.",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  sLastMsg = true;
  return true;
}

Assistant:

bool TSDemuxer::checkForRealM2ts(const uint8_t* buffer, const uint8_t* end) const
{
    for (const uint8_t* cur = buffer; cur < end; cur += 192)
        if (cur[4] != 0x47)
            return false;
    for (const uint8_t* cur = buffer; cur < end; cur += 188)
        if (*cur != 0x47)
        {
            LTRACE(LT_WARN, 2, "Warning! The file " << m_streamName << " has a M2TS format.");
            return true;
        }
    return false;
}